

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_catalog_entry.hpp
# Opt level: O3

void __thiscall
duckdb::CollateCatalogEntry::CollateCatalogEntry
          (CollateCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateCollationInfo *info)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  FunctionNullHandling FVar3;
  FunctionErrors FVar4;
  FunctionCollationHandling FVar5;
  long lVar6;
  bind_scalar_function_t *pp_Var7;
  bind_scalar_function_t *pp_Var8;
  byte bVar9;
  string local_50;
  
  bVar9 = 0;
  pcVar1 = (info->name)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (info->name)._M_string_length);
  StandardEntry::StandardEntry(&this->super_StandardEntry,COLLATION_ENTRY,schema,catalog,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__CollateCatalogEntry_01985b78;
  SimpleFunction::SimpleFunction
            ((SimpleFunction *)&this->function,(SimpleFunction *)&info->function);
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::LogicalType
            (&(this->function).super_BaseScalarFunction.return_type,
             &(info->function).super_BaseScalarFunction.return_type);
  FVar3 = (info->function).super_BaseScalarFunction.null_handling;
  FVar4 = (info->function).super_BaseScalarFunction.errors;
  FVar5 = (info->function).super_BaseScalarFunction.collation_handling;
  (this->function).super_BaseScalarFunction.stability =
       (info->function).super_BaseScalarFunction.stability;
  (this->function).super_BaseScalarFunction.null_handling = FVar3;
  (this->function).super_BaseScalarFunction.errors = FVar4;
  (this->function).super_BaseScalarFunction.collation_handling = FVar5;
  (this->function).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (&(this->function).function,&(info->function).function);
  pp_Var7 = &(info->function).bind;
  pp_Var8 = &(this->function).bind;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pp_Var8 = *pp_Var7;
    pp_Var7 = pp_Var7 + (ulong)bVar9 * -2 + 1;
    pp_Var8 = pp_Var8 + (ulong)bVar9 * -2 + 1;
  }
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (info->function).function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (info->function).function_info.internal.
           super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->function).function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->combinable = info->combinable;
  this->not_required_for_equality = info->not_required_for_equality;
  return;
}

Assistant:

CollateCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema, CreateCollationInfo &info)
	    : StandardEntry(CatalogType::COLLATION_ENTRY, schema, catalog, info.name), function(info.function),
	      combinable(info.combinable), not_required_for_equality(info.not_required_for_equality) {
	}